

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_types.c
# Opt level: O0

void allocateCommitments2
               (commitments_t *commitments,picnic_instance_t *params,size_t numCommitments)

{
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  size_t i;
  uint8_t *slab;
  ulong local_28;
  void *local_20;
  
  in_RDI[1] = in_RDX;
  local_20 = malloc(in_RDX * *(byte *)(in_RSI + 6) + in_RDX * 8);
  *in_RDI = (long)local_20;
  local_20 = (void *)(in_RDX * 8 + (long)local_20);
  for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
    *(void **)(*in_RDI + local_28 * 8) = local_20;
    local_20 = (void *)((long)local_20 + (long)(int)(uint)*(byte *)(in_RSI + 6));
  }
  return;
}

Assistant:

void allocateCommitments2(commitments_t* commitments, const picnic_instance_t* params,
                          size_t numCommitments) {
  commitments->nCommitments = numCommitments;

  uint8_t* slab = malloc(numCommitments * params->digest_size + numCommitments * sizeof(uint8_t*));

  commitments->hashes = (uint8_t**)slab;
  slab += numCommitments * sizeof(uint8_t*);

  for (size_t i = 0; i < numCommitments; i++) {
    commitments->hashes[i] = slab;
    slab += params->digest_size;
  }
}